

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adplanner.cpp
# Opt level: O1

bool __thiscall
ADPlanner::Search(ADPlanner *this,ADSearchStateSpace_t *pSearchStateSpace,
                 vector<int,_std::allocator<int>_> *pathIds,int *PathCost,bool bFirstSolution,
                 bool bOptimalSolution,double MaxNumofSecs)

{
  pointer *ppPVar1;
  DiscreteSpaceInformation *pDVar2;
  pointer pPVar3;
  iterator __position;
  double dVar4;
  int iVar5;
  clock_t cVar6;
  clock_t cVar7;
  bool bVar8;
  uint uVar9;
  int solcost;
  PlannerStats tempStat;
  double local_88;
  undefined4 local_7c;
  PlannerStats local_78;
  vector<int,_std::allocator<int>_> *local_58;
  double local_50;
  int *local_48;
  vector<PlannerStats,std::allocator<PlannerStats>> *local_40;
  double local_38;
  
  local_58 = pathIds;
  local_48 = PathCost;
  cVar6 = clock();
  this->TimeStarted = cVar6;
  this->searchexpands = 0;
  local_50 = this->repair_time;
  if (this->use_repair_time == false) {
    this->repair_time = MaxNumofSecs;
  }
  if (pSearchStateSpace->bReevaluatefvals == true) {
    pDVar2 = (this->super_SBPLPlanner).environment_;
    (*pDVar2->_vptr_DiscreteSpaceInformation[0x19])(pDVar2,(ulong)this->bforwardsearch);
    (*(this->super_SBPLPlanner)._vptr_SBPLPlanner[0x28])(this,pSearchStateSpace);
  }
  if (pSearchStateSpace->bReinitializeSearchStateSpace == true) {
    (*(this->super_SBPLPlanner)._vptr_SBPLPlanner[0x2c])(this,pSearchStateSpace);
  }
  if (bOptimalSolution) {
    pSearchStateSpace->eps = 1.0;
  }
  else {
    local_88 = MaxNumofSecs;
    if (!bFirstSolution) goto LAB_001359fb;
  }
  this->repair_time = 1000000000.0;
  local_88 = 1000000000.0;
LAB_001359fb:
  pPVar3 = (this->stats).super__Vector_base<PlannerStats,_std::allocator<PlannerStats>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->stats).super__Vector_base<PlannerStats,_std::allocator<PlannerStats>_>._M_impl.
      super__Vector_impl_data._M_finish != pPVar3) {
    (this->stats).super__Vector_base<PlannerStats,_std::allocator<PlannerStats>_>._M_impl.
    super__Vector_impl_data._M_finish = pPVar3;
  }
  local_40 = (vector<PlannerStats,std::allocator<PlannerStats>> *)&this->stats;
  local_38 = local_88 * 1000000.0;
  uVar9 = 0;
  while (((this->final_epsilon <= pSearchStateSpace->eps_satisfied &&
           pSearchStateSpace->eps_satisfied != this->final_epsilon &&
          (cVar6 = clock(), (double)(cVar6 - this->TimeStarted) < local_38)) &&
         (((pSearchStateSpace->eps_satisfied == 1000000000.0 &&
           (!NAN(pSearchStateSpace->eps_satisfied))) ||
          (cVar6 = clock(), (double)(cVar6 - this->TimeStarted) < this->repair_time * 1000000.0)))))
  {
    cVar6 = clock();
    if (pSearchStateSpace->searchiteration == 0) {
      pSearchStateSpace->searchiteration = 1;
    }
    if (ABS(pSearchStateSpace->eps_satisfied - pSearchStateSpace->eps) < 1e-07 && !bFirstSolution) {
      dVar4 = pSearchStateSpace->eps - this->dec_eps;
      pSearchStateSpace->eps = dVar4;
      if (dVar4 < this->final_epsilon) {
        pSearchStateSpace->eps = this->final_epsilon;
      }
      pSearchStateSpace->bReevaluatefvals = true;
      pSearchStateSpace->bRebuildOpenList = true;
      pSearchStateSpace->searchiteration = pSearchStateSpace->searchiteration + 1;
    }
    if (pSearchStateSpace->bRebuildOpenList == true) {
      (*(this->super_SBPLPlanner)._vptr_SBPLPlanner[0x26])(this,pSearchStateSpace);
    }
    if (pSearchStateSpace->bReevaluatefvals == true) {
      (*(this->super_SBPLPlanner)._vptr_SBPLPlanner[0x27])(this,pSearchStateSpace);
    }
    iVar5 = (*(this->super_SBPLPlanner)._vptr_SBPLPlanner[0x25])
                      (SUB84(local_88,0),this,pSearchStateSpace);
    if (iVar5 == 1) {
      pSearchStateSpace->eps_satisfied = pSearchStateSpace->eps;
    }
    dVar4 = this->finitial_eps;
    if (pSearchStateSpace->eps_satisfied == dVar4) {
      if ((pSearchStateSpace->eps == dVar4) && (!NAN(pSearchStateSpace->eps) && !NAN(dVar4))) {
        cVar7 = clock();
        this->finitial_eps_planning_time = (double)(cVar7 - cVar6) / 1000000.0;
        this->num_of_expands_initial_solution = this->searchexpands - uVar9;
      }
    }
    pPVar3 = (this->stats).super__Vector_base<PlannerStats,_std::allocator<PlannerStats>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if ((this->stats).super__Vector_base<PlannerStats,_std::allocator<PlannerStats>_>._M_impl.
        super__Vector_impl_data._M_start == pPVar3) {
LAB_00135bb8:
      local_78.eps = pSearchStateSpace->eps_satisfied;
      local_78.expands = this->searchexpands - uVar9;
      cVar7 = clock();
      local_78.time = (double)(cVar7 - cVar6) / 1000000.0;
      local_78.cost = *(int *)((long)pSearchStateSpace->searchgoalstate->PlannerSpecificData + 0x24)
      ;
      __position._M_current =
           (this->stats).super__Vector_base<PlannerStats,_std::allocator<PlannerStats>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->stats).super__Vector_base<PlannerStats,_std::allocator<PlannerStats>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<PlannerStats,std::allocator<PlannerStats>>::
        _M_realloc_insert<PlannerStats_const&>(local_40,__position,&local_78);
      }
      else {
        (__position._M_current)->time = local_78.time;
        *(ulong *)&(__position._M_current)->expands = CONCAT44(local_78._28_4_,local_78.expands);
        (__position._M_current)->eps = local_78.eps;
        *(ulong *)&(__position._M_current)->cost = CONCAT44(local_78._12_4_,local_78.cost);
        ppPVar1 = &(this->stats).super__Vector_base<PlannerStats,_std::allocator<PlannerStats>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppPVar1 = *ppPVar1 + 1;
      }
    }
    else {
      pPVar3 = pPVar3 + -1;
      if ((pSearchStateSpace->eps_satisfied != pPVar3->eps) ||
         (NAN(pSearchStateSpace->eps_satisfied) || NAN(pPVar3->eps))) goto LAB_00135bb8;
    }
    if ((bFirstSolution) ||
       (uVar9 = this->searchexpands,
       *(int *)((long)pSearchStateSpace->searchgoalstate->PlannerSpecificData + 0x24) == 1000000000)
       ) break;
  }
  this->repair_time = local_50;
  *local_48 = *(int *)((long)pSearchStateSpace->searchgoalstate->PlannerSpecificData + 0x24);
  pDVar2 = (this->super_SBPLPlanner).environment_;
  this->MaxMemoryCounter =
       this->MaxMemoryCounter +
       ((uint)((ulong)((long)(pDVar2->StateID2IndexMapping).
                             super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)(pDVar2->StateID2IndexMapping).
                            super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                            super__Vector_impl_data._M_start) >> 1) & 0xfffffffc);
  local_7c = 1000000000;
  if ((*local_48 == 1000000000) ||
     ((dVar4 = this->pSearchStateSpace_->eps_satisfied, dVar4 == 1000000000.0 && (!NAN(dVar4))))) {
    bVar8 = false;
  }
  else {
    (*(this->super_SBPLPlanner)._vptr_SBPLPlanner[0x34])(&local_78,this,pSearchStateSpace,&local_7c)
    ;
    std::vector<int,_std::allocator<int>_>::_M_move_assign(local_58,&local_78);
    if ((void *)local_78.eps != (void *)0x0) {
      operator_delete((void *)local_78.eps,(long)local_78.time - (long)local_78.eps);
    }
    bVar8 = true;
  }
  cVar6 = clock();
  this->final_eps_planning_time = (double)(cVar6 - this->TimeStarted) / 1000000.0;
  this->final_eps = pSearchStateSpace->eps_satisfied;
  return bVar8;
}

Assistant:

bool ADPlanner::Search(ADSearchStateSpace_t* pSearchStateSpace, vector<int>& pathIds, int & PathCost,
                       bool bFirstSolution, bool bOptimalSolution, double MaxNumofSecs)
{
    CKey key;
    TimeStarted = clock();
    searchexpands = 0;
    double old_repair_time = repair_time;
    if (!use_repair_time) repair_time = MaxNumofSecs;

#if DEBUG
    SBPL_FPRINTF(fDeb, "new search call (call number=%d)\n", pSearchStateSpace->callnumber);
#endif

    if (pSearchStateSpace->bReevaluatefvals) {
        // costs have changed or a new goal has been set
        environment_->EnsureHeuristicsUpdated(bforwardsearch);
        Reevaluatehvals(pSearchStateSpace);
    }


    if (pSearchStateSpace->bReinitializeSearchStateSpace == true) {
        //re-initialize state space
        ReInitializeSearchStateSpace(pSearchStateSpace);
    }

    if (bOptimalSolution) {
        pSearchStateSpace->eps = 1;
        MaxNumofSecs = INFINITECOST;
        repair_time = INFINITECOST;
    }
    else if (bFirstSolution) {
        MaxNumofSecs = INFINITECOST;
        repair_time = INFINITECOST;
    }

    //the main loop of AD*
    stats.clear();
    int prevexpands = 0;
    clock_t loop_time;
    while (pSearchStateSpace->eps_satisfied > final_epsilon &&
           (clock() - TimeStarted) < MaxNumofSecs * (double)CLOCKS_PER_SEC &&
               (pSearchStateSpace->eps_satisfied == INFINITECOST ||
               (clock() - TimeStarted) < repair_time * (double)CLOCKS_PER_SEC))
    {
        loop_time = clock();
        //it will be a new search iteration
        if (pSearchStateSpace->searchiteration == 0) pSearchStateSpace->searchiteration++;

        //decrease eps for all subsequent iterations
        if (fabs(pSearchStateSpace->eps_satisfied - pSearchStateSpace->eps) < ERR_EPS && !bFirstSolution) {
            pSearchStateSpace->eps = pSearchStateSpace->eps - dec_eps;
            if (pSearchStateSpace->eps < final_epsilon) pSearchStateSpace->eps = final_epsilon;

            pSearchStateSpace->bReevaluatefvals = true;
            pSearchStateSpace->bRebuildOpenList = true;

            pSearchStateSpace->searchiteration++;
        }

        //build a new open list by merging it with incons one
        if (pSearchStateSpace->bRebuildOpenList) BuildNewOPENList(pSearchStateSpace);

        //re-compute f-values if necessary and reorder the heap
        if (pSearchStateSpace->bReevaluatefvals) Reevaluatefvals(pSearchStateSpace);

        //improve or compute path
        if (ComputePath(pSearchStateSpace, MaxNumofSecs) == 1) {
            pSearchStateSpace->eps_satisfied = pSearchStateSpace->eps;
        }

        //print the solution cost and eps bound
        SBPL_PRINTF("eps=%f expands=%d g(sstart)=%d\n", pSearchStateSpace->eps_satisfied, searchexpands - prevexpands,
                    ((ADState*)pSearchStateSpace->searchgoalstate->PlannerSpecificData)->g);

        if (pSearchStateSpace->eps_satisfied == finitial_eps && pSearchStateSpace->eps == finitial_eps) {
            finitial_eps_planning_time = double(clock() - loop_time) / CLOCKS_PER_SEC;
            num_of_expands_initial_solution = searchexpands - prevexpands;
        }

        if (stats.empty() || pSearchStateSpace->eps_satisfied != stats.back().eps) {
            PlannerStats tempStat;
            tempStat.eps = pSearchStateSpace->eps_satisfied;
            tempStat.expands = searchexpands - prevexpands;
            tempStat.time = double(clock() - loop_time) / CLOCKS_PER_SEC;
            tempStat.cost = ((ADState*)pSearchStateSpace->searchgoalstate->PlannerSpecificData)->g;
            stats.push_back(tempStat);
        }

#if DEBUG
        SBPL_FPRINTF(fDeb, "eps=%f eps_sat=%f expands=%d g(sstart)=%d\n", pSearchStateSpace->eps,
                     pSearchStateSpace->eps_satisfied, searchexpands - prevexpands,
                     ((ADState*)pSearchStateSpace->searchgoalstate->PlannerSpecificData)->g);
#endif
        prevexpands = searchexpands;

        //if just the first solution then we are done
        if (bFirstSolution) break;

        //no solution exists
        if (((ADState*)pSearchStateSpace->searchgoalstate->PlannerSpecificData)->g == INFINITECOST) break;

    }
    repair_time = old_repair_time;

#if DEBUG
    SBPL_FFLUSH(fDeb);
#endif

    PathCost = ((ADState*)pSearchStateSpace->searchgoalstate->PlannerSpecificData)->g;
    MaxMemoryCounter += environment_->StateID2IndexMapping.size() * sizeof(int);

    SBPL_PRINTF("MaxMemoryCounter = %d\n", MaxMemoryCounter);

    int solcost = INFINITECOST;
    bool ret = false;
    if (PathCost == INFINITECOST || pSearchStateSpace_->eps_satisfied == INFINITECOST) {
        SBPL_PRINTF("could not find a solution\n");
        ret = false;
    }
    else {
        SBPL_PRINTF("solution is found\n");

        pathIds = GetSearchPath(pSearchStateSpace, solcost);
        ret = true;
    }

    SBPL_PRINTF("total expands this call = %d, planning time = %.3f secs, solution cost=%d\n", searchexpands, (clock()
        - TimeStarted) / ((double)CLOCKS_PER_SEC), solcost);
    final_eps_planning_time = (clock() - TimeStarted) / ((double)CLOCKS_PER_SEC);
    final_eps = pSearchStateSpace->eps_satisfied;

    //SBPL_FPRINTF(fStat, "%d %d\n", searchexpands, solcost);

    return ret;

}